

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O3

void __thiscall OpenSteer::DrawSphereHelper::draw(DrawSphereHelper *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec3 local_f0;
  Vec3 local_e0;
  Vec3 local_d0;
  Vec3 local_c0;
  Vec3 local_b0;
  Vec3 local_a0;
  Vec3 local_90;
  Vec3 local_80;
  Vec3 local_70;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  
  fVar5 = this->radius / 0.58778524;
  fVar3 = fVar5 * 0.5;
  fVar5 = fVar5 / 3.236068;
  local_e0.z = (this->center).z;
  local_b0.z = local_e0.z - fVar3;
  local_c0.z = local_e0.z + 0.0;
  local_a0.z = fVar3 + local_e0.z;
  local_f0.z = fVar5 + local_e0.z;
  uVar1 = (this->center).x;
  uVar2 = (this->center).y;
  fVar4 = (float)uVar1 + 0.0;
  fVar6 = (float)uVar2 + 0.0;
  local_e0.z = local_e0.z - fVar5;
  local_40.y = fVar3 + (float)uVar2;
  local_40.x = (float)uVar1 + fVar5;
  local_80.y = fVar5 + (float)uVar2;
  local_80.x = fVar4;
  local_90.y = fVar3 + (float)uVar2;
  local_90.x = (float)uVar1 - fVar5;
  local_50.y = fVar5 + (float)uVar2;
  local_50.x = fVar4;
  local_a0.y = (float)uVar2 - fVar5;
  local_a0.x = fVar4;
  local_e0.y = fVar6;
  local_e0.x = fVar3 + (float)uVar1;
  local_f0.y = fVar6;
  local_f0.x = fVar3 + (float)uVar1;
  local_d0.y = fVar6;
  local_d0.x = (float)uVar1 - fVar3;
  local_b0.y = (float)uVar2 - fVar5;
  local_b0.x = fVar4;
  local_60.y = fVar6;
  local_60.x = (float)uVar1 - fVar3;
  local_c0.y = (float)uVar2 - fVar3;
  local_c0.x = (float)uVar1 + fVar5;
  local_70.y = (float)uVar2 - fVar3;
  local_70.x = (float)uVar1 - fVar5;
  local_d0.z = local_f0.z;
  local_90.z = local_c0.z;
  local_80.z = local_b0.z;
  local_70.z = local_c0.z;
  local_60.z = local_e0.z;
  local_50.z = local_a0.z;
  local_40.z = local_c0.z;
  drawMeshedTriangleOnSphere(this,&local_80,&local_40,&local_90);
  drawMeshedTriangleOnSphere(this,&local_50,&local_90,&local_40);
  drawMeshedTriangleOnSphere(this,&local_50,&local_a0,&local_d0);
  drawMeshedTriangleOnSphere(this,&local_50,&local_f0,&local_a0);
  drawMeshedTriangleOnSphere(this,&local_80,&local_b0,&local_e0);
  drawMeshedTriangleOnSphere(this,&local_80,&local_60,&local_b0);
  drawMeshedTriangleOnSphere(this,&local_a0,&local_c0,&local_70);
  drawMeshedTriangleOnSphere(this,&local_b0,&local_70,&local_c0);
  drawMeshedTriangleOnSphere(this,&local_90,&local_d0,&local_60);
  drawMeshedTriangleOnSphere(this,&local_70,&local_60,&local_d0);
  drawMeshedTriangleOnSphere(this,&local_40,&local_e0,&local_f0);
  drawMeshedTriangleOnSphere(this,&local_c0,&local_f0,&local_e0);
  drawMeshedTriangleOnSphere(this,&local_50,&local_d0,&local_90);
  drawMeshedTriangleOnSphere(this,&local_50,&local_40,&local_f0);
  drawMeshedTriangleOnSphere(this,&local_80,&local_90,&local_60);
  drawMeshedTriangleOnSphere(this,&local_80,&local_e0,&local_40);
  drawMeshedTriangleOnSphere(this,&local_b0,&local_60,&local_70);
  drawMeshedTriangleOnSphere(this,&local_b0,&local_c0,&local_e0);
  drawMeshedTriangleOnSphere(this,&local_a0,&local_70,&local_d0);
  drawMeshedTriangleOnSphere(this,&local_a0,&local_f0,&local_c0);
  return;
}

Assistant:

void draw (void) const
        {
            // Geometry based on Paul Bourke's excellent article:
            //   Platonic Solids (Regular polytopes in 3D)
            //   http://astronomy.swin.edu.au/~pbourke/polyhedra/platonic/
            const float sqrt5 = sqrtXXX (5.0f);
            const float phi = (1.0f + sqrt5) * 0.5f; // "golden ratio"
            // ratio of edge length to radius
            const float ratio = sqrtXXX (10.0f + (2.0f * sqrt5)) / (4.0f * phi);
            const float a = (radius / ratio) * 0.5f;
            const float b = (radius / ratio) / (2.0f * phi);

            // define the icosahedron's 12 vertices:
            const Vec3 v1  = center + Vec3 ( 0,  b, -a);
            const Vec3 v2  = center + Vec3 ( b,  a,  0);
            const Vec3 v3  = center + Vec3 (-b,  a,  0);
            const Vec3 v4  = center + Vec3 ( 0,  b,  a);
            const Vec3 v5  = center + Vec3 ( 0, -b,  a);
            const Vec3 v6  = center + Vec3 (-a,  0,  b);
            const Vec3 v7  = center + Vec3 ( 0, -b, -a);
            const Vec3 v8  = center + Vec3 ( a,  0, -b);
            const Vec3 v9  = center + Vec3 ( a,  0,  b);
            const Vec3 v10 = center + Vec3 (-a,  0, -b);
            const Vec3 v11 = center + Vec3 ( b, -a,  0);
            const Vec3 v12 = center + Vec3 (-b, -a,  0);

            // draw the icosahedron's 20 triangular faces:
            drawMeshedTriangleOnSphere (v1, v2, v3);
            drawMeshedTriangleOnSphere (v4, v3, v2);
            drawMeshedTriangleOnSphere (v4, v5, v6);
            drawMeshedTriangleOnSphere (v4, v9, v5);
            drawMeshedTriangleOnSphere (v1, v7, v8);
            drawMeshedTriangleOnSphere (v1, v10, v7);
            drawMeshedTriangleOnSphere (v5, v11, v12);
            drawMeshedTriangleOnSphere (v7, v12, v11);
            drawMeshedTriangleOnSphere (v3, v6, v10);
            drawMeshedTriangleOnSphere (v12, v10, v6);
            drawMeshedTriangleOnSphere (v2, v8, v9);
            drawMeshedTriangleOnSphere (v11, v9, v8);
            drawMeshedTriangleOnSphere (v4, v6, v3);
            drawMeshedTriangleOnSphere (v4, v2, v9);
            drawMeshedTriangleOnSphere (v1, v3, v10);
            drawMeshedTriangleOnSphere (v1, v8, v2);
            drawMeshedTriangleOnSphere (v7, v10, v12);
            drawMeshedTriangleOnSphere (v7, v11, v8);
            drawMeshedTriangleOnSphere (v5, v12, v6);
            drawMeshedTriangleOnSphere (v5, v9, v11);
        }